

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charset_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::basic_chset<char>_>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *prVar4;
  ulong uVar5;
  long *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  undefined1 local_22;
  undefined1 local_1;
  
  bVar2 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::eos(in_RDI);
  local_22 = 1;
  if (!bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(in_RSI);
    cVar1 = *pcVar3;
    prVar4 = traits_cast<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       ((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x1740ae);
    bVar2 = basic_chset_8bit<char>::
            test<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      ((basic_chset_8bit<char> *)in_RDI,(int)cVar1,prVar4);
    local_22 = bVar2 ^ 0xff;
  }
  if ((local_22 & 1) == 0) {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(in_RSI);
    uVar5 = (**(code **)(*in_RDX + 0x10))(in_RDX,in_RSI);
    if ((uVar5 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--(in_RSI);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(state.eos() || !this->charset_.test(*state.cur_, traits_cast<Traits>(state), icase_type()))
            {
                return false;
            }

            ++state.cur_;
            if(next.match(state))
            {
                return true;
            }

            --state.cur_;
            return false;
        }